

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_ptr<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,unsigned_long value,
          basic_format_specs<wchar_t> *specs)

{
  unsigned_long uVar1;
  int value_00;
  type tVar2;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *pbVar3;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it;
  undefined1 local_48 [8];
  anon_class_16_2_92d121e5 write;
  size_t size;
  int num_digits;
  basic_format_specs<wchar_t> *specs_local;
  unsigned_long value_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  value_local = (unsigned_long)out.container;
  value_00 = count_digits<4,unsigned_long>(value);
  tVar2 = to_unsigned<int>(value_00);
  uVar1 = value_local;
  write._8_8_ = (ulong)tVar2 + 2;
  local_48 = (undefined1  [8])value;
  write.value._0_4_ = value_00;
  if (specs == (basic_format_specs<wchar_t> *)0x0) {
    pbVar3 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                       ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *)&value_local,
                        write._8_8_);
    it = write_ptr<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_unsigned_long>
         ::anon_class_16_2_92d121e5::operator()
                   ((anon_class_16_2_92d121e5 *)local_48,pbVar3->container);
    out_local = base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                          ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)uVar1,it);
  }
  else {
    out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_ptr<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long,fmt::v8::basic_format_specs<wchar_t>const*)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                          ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)value_local,
                           specs,write._8_8_,(anon_class_16_2_92d121e5 *)local_48);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out_local.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}